

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsGenerators.cpp
# Opt level: O2

void __thiscall
chrono::utils::MixtureIngredient::setMaterialProperties
          (MixtureIngredient *this,shared_ptr<chrono::ChMaterialSurfaceSMC> *mat)

{
  element_type *peVar1;
  element_type *peVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  peVar1 = (this->m_defMaterialSMC).
           super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar2 = (mat->super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  (peVar2->super_ChMaterialSurface).restitution = (peVar1->super_ChMaterialSurface).restitution;
  fVar8 = (peVar1->super_ChMaterialSurface).sliding_friction;
  fVar3 = (peVar1->super_ChMaterialSurface).rolling_friction;
  fVar4 = (peVar1->super_ChMaterialSurface).spinning_friction;
  (peVar2->super_ChMaterialSurface).static_friction =
       (peVar1->super_ChMaterialSurface).static_friction;
  (peVar2->super_ChMaterialSurface).sliding_friction = fVar8;
  (peVar2->super_ChMaterialSurface).rolling_friction = fVar3;
  (peVar2->super_ChMaterialSurface).spinning_friction = fVar4;
  peVar2->gt = peVar1->gt;
  fVar8 = peVar1->constant_adhesion;
  fVar3 = peVar1->adhesionMultDMT;
  fVar4 = peVar1->adhesionSPerko;
  fVar5 = peVar1->kn;
  fVar6 = peVar1->kt;
  fVar7 = peVar1->gn;
  *(undefined8 *)&(peVar2->super_ChMaterialSurface).field_0x1c =
       *(undefined8 *)&(peVar1->super_ChMaterialSurface).field_0x1c;
  peVar2->constant_adhesion = fVar8;
  peVar2->adhesionMultDMT = fVar3;
  peVar2->adhesionSPerko = fVar4;
  peVar2->kn = fVar5;
  peVar2->kt = fVar6;
  peVar2->gn = fVar7;
  if (this->m_youngDist != (normal_distribution<float> *)0x0) {
    peVar1 = (mat->super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    fVar8 = sampleTruncatedDist<float>(this->m_youngDist,this->m_minYoung,this->m_maxYoung);
    *(float *)&(peVar1->super_ChMaterialSurface).field_0x1c = fVar8;
  }
  if (this->m_poissonDist != (normal_distribution<float> *)0x0) {
    peVar1 = (mat->super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    fVar8 = sampleTruncatedDist<float>(this->m_poissonDist,this->m_minPoisson,this->m_maxPoisson);
    peVar1->poisson_ratio = fVar8;
  }
  if (this->m_frictionDist != (normal_distribution<float> *)0x0) {
    peVar1 = (mat->super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    fVar8 = sampleTruncatedDist<float>(this->m_frictionDist,this->m_minFriction,this->m_maxFriction)
    ;
    ChMaterialSurface::SetFriction(&peVar1->super_ChMaterialSurface,fVar8);
  }
  if (this->m_restitutionDist != (normal_distribution<float> *)0x0) {
    peVar1 = (mat->super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    fVar8 = sampleTruncatedDist<float>
                      (this->m_restitutionDist,this->m_minRestitution,this->m_maxRestitution);
    (peVar1->super_ChMaterialSurface).restitution = fVar8;
  }
  if (this->m_cohesionDist != (normal_distribution<float> *)0x0) {
    peVar1 = (mat->super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    fVar8 = sampleTruncatedDist<float>(this->m_cohesionDist,this->m_minCohesion,this->m_maxCohesion)
    ;
    peVar1->constant_adhesion = fVar8;
  }
  return;
}

Assistant:

void MixtureIngredient::setMaterialProperties(std::shared_ptr<ChMaterialSurfaceSMC> mat) {
    // Copy properties from the default material.
    *mat = *m_defMaterialSMC;

    // If using distributions for any of the supported properties, override those.
    if (m_youngDist)
        mat->SetYoungModulus(sampleTruncatedDist<float>(*m_youngDist, m_minYoung, m_maxYoung));

    if (m_poissonDist)
        mat->SetPoissonRatio(sampleTruncatedDist<float>(*m_poissonDist, m_minPoisson, m_maxPoisson));

    if (m_frictionDist)
        mat->SetFriction(sampleTruncatedDist<float>(*m_frictionDist, m_minFriction, m_maxFriction));

    if (m_restitutionDist)
        mat->SetRestitution(sampleTruncatedDist<float>(*m_restitutionDist, m_minRestitution, m_maxRestitution));

    if (m_cohesionDist)
        mat->SetAdhesion(sampleTruncatedDist<float>(*m_cohesionDist, m_minCohesion, m_maxCohesion));
}